

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_manager.cpp
# Opt level: O0

void __thiscall cfd::CfdManager::Finalize(CfdManager *this,bool is_finish_process)

{
  byte in_SIL;
  CfdSourceLocation *in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  if ((((ulong)in_RDI->funcname & 1) != 0) && (((ulong)in_RDI->funcname & 0x100) == 0)) {
    if ((bool)(in_SIL & 1) == false) {
      strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_manager.cpp"
              ,0x2f);
      core::logger::info<>(in_RDI,in_stack_ffffffffffffffc8);
    }
    cfd::core::Finalize(*(void **)&in_RDI->line,(bool)(in_SIL & 1));
    *(undefined1 *)((long)&in_RDI->funcname + 1) = 1;
    *(undefined8 *)&in_RDI->line = 0;
  }
  return;
}

Assistant:

void CfdManager::Finalize(bool is_finish_process) {
  if (initialized_ && (!finalized_)) {
    if (!is_finish_process) {
      info(CFD_LOG_SOURCE, "cfd finalize.");
    }
    cfd::core::Finalize(handle_, is_finish_process);
    finalized_ = true;
    handle_ = nullptr;
  }
}